

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Vector3f * phyr::uniformSampleCone(Point2f *u,double cosThetaMax)

{
  Point2<double> *in_RSI;
  Vector3<double> *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double phi;
  double sinTheta;
  double cosTheta;
  
  dVar1 = Point2<double>::operator[](in_RSI,0);
  dVar2 = Point2<double>::operator[](in_RSI,0);
  dVar1 = dVar2 * in_XMM0_Qa + (1.0 - dVar1);
  dVar2 = sqrt(-dVar1 * dVar1 + 1.0);
  dVar3 = Point2<double>::operator[](in_RSI,1);
  dVar3 = dVar3 * 2.0 * 3.141592653589793;
  dVar4 = cos(dVar3);
  dVar3 = sin(dVar3);
  Vector3<double>::Vector3(in_RDI,dVar4 * dVar2,dVar3 * dVar2,dVar1);
  return in_RDI;
}

Assistant:

Vector3f uniformSampleCone(const Point2f& u, Real cosThetaMax) {
    Real cosTheta = ((Real)1 - u[0]) + u[0] * cosThetaMax;
    Real sinTheta = std::sqrt((Real)1 - cosTheta * cosTheta);
    Real phi = u[1] * 2 * Pi;
    return Vector3f(std::cos(phi) * sinTheta, std::sin(phi) * sinTheta, cosTheta);
}